

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::splitFrom
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  size_t sVar3;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar4;
  ulong extraout_RDX;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  VerySimpleReadOnlyString VVar8;
  
  uVar1 = find->length;
  __s = find->data;
  uVar7 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  uVar4 = 0;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (uVar2 < uVar1) {
      uVar5 = uVar1;
    }
    uVar6 = 0;
LAB_00112f63:
    if (uVar5 + (int)uVar4 == uVar6) goto LAB_00112f8d;
    if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar6) ==
        __s[uVar2 + uVar6]) break;
    uVar2 = uVar2 + 1;
    uVar4 = (ulong)((int)uVar4 - 1);
  } while( true );
  uVar6 = uVar6 + 1;
  if (uVar7 == uVar6) {
    if (uVar2 == uVar1) {
LAB_00112f8d:
      if (in_CL == '\0') {
        this->data = "";
        this->length = 0;
      }
      else {
        this->data = __s;
        this->length = uVar1;
        find->data = __s + (int)uVar1;
        find->length = 0;
      }
    }
    else {
      uVar7 = uVar7 + uVar2;
      if (in_CL != '\0') {
        uVar2 = uVar7;
      }
      this->data = __s;
      if (uVar2 == 0xffffffff) {
        sVar3 = strlen(__s);
        uVar2 = (uint)sVar3;
        uVar4 = extraout_RDX;
      }
      this->length = uVar2;
      find->data = __s + (int)uVar7;
      find->length = uVar1 - uVar7;
    }
    VVar8._8_8_ = uVar4;
    VVar8.data = (tCharPtr)this;
    return VVar8;
  }
  goto LAB_00112f63;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::splitFrom(const VerySimpleReadOnlyString & find, const bool includeFind)
	{
	    const unsigned int pos = Find(find);
	    if (pos == (unsigned int)length)
	    {
	        if (includeFind)
	        {
	            VerySimpleReadOnlyString ret(*this);
                (void)Mutate(data + length, 0);
	            return ret;
	        }
	        return VerySimpleReadOnlyString("", 0);
	    }
	    const int size = pos + find.length;
	    VerySimpleReadOnlyString ret(data, includeFind ? size : pos);
        (void)Mutate(data + size, length - size);
	    return ret;
	}